

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

Id dxil_spv::build_masked_ballot(Impl *impl,Id input_value)

{
  Impl *pIVar1;
  Id IVar2;
  Id local_50;
  Id local_4c;
  initializer_list<unsigned_int> local_48;
  Operation *local_38;
  Operation *is_active_ballot;
  Operation *is_active;
  Operation *is_helper;
  Builder *builder;
  Impl *pIStack_10;
  Id input_value_local;
  Impl *impl_local;
  
  builder._4_4_ = input_value;
  pIStack_10 = impl;
  is_helper = (Operation *)Converter::Impl::builder(impl);
  pIVar1 = pIStack_10;
  IVar2 = spv::Builder::makeBoolType((Builder *)is_helper);
  is_active = Converter::Impl::allocate(pIVar1,OpIsHelperInvocationEXT,IVar2);
  Converter::Impl::add(pIStack_10,is_active,false);
  pIVar1 = pIStack_10;
  IVar2 = spv::Builder::makeBoolType((Builder *)is_helper);
  is_active_ballot = Converter::Impl::allocate(pIVar1,OpLogicalNot,IVar2);
  Operation::add_id(is_active_ballot,is_active->id);
  Converter::Impl::add(pIStack_10,is_active_ballot,false);
  pIVar1 = pIStack_10;
  IVar2 = spv::Builder::makeBoolType((Builder *)is_helper);
  local_38 = Converter::Impl::allocate(pIVar1,OpLogicalAnd,IVar2);
  local_50 = builder._4_4_;
  local_4c = is_active_ballot->id;
  local_48._M_array = &local_50;
  local_48._M_len = 2;
  Operation::add_ids(local_38,&local_48);
  Converter::Impl::add(pIStack_10,local_38,false);
  return local_38->id;
}

Assistant:

static spv::Id build_masked_ballot(Converter::Impl &impl, spv::Id input_value)
{
	auto &builder = impl.builder();

	auto *is_helper = impl.allocate(spv::OpIsHelperInvocationEXT, builder.makeBoolType());
	impl.add(is_helper);

	auto *is_active = impl.allocate(spv::OpLogicalNot, builder.makeBoolType());
	is_active->add_id(is_helper->id);
	impl.add(is_active);

	auto *is_active_ballot = impl.allocate(spv::OpLogicalAnd, builder.makeBoolType());
	is_active_ballot->add_ids({ input_value, is_active->id });
	impl.add(is_active_ballot);

	return is_active_ballot->id;
}